

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.h
# Opt level: O3

void __thiscall pbrt::Transform::Transform(Transform *this,Quaternion *q)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  Float aFVar6 [4];
  float fVar7;
  float fVar8;
  ulong uVar9;
  int i;
  long lVar10;
  Float (*paFVar11) [4];
  int i_1;
  Transform *pTVar12;
  undefined8 *puVar13;
  int i_2;
  SquareMatrix<4> *pSVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  SquareMatrix<4> r;
  
  auVar16 = vpmovsxbq_avx2(ZEXT416(0x3020100));
  lVar10 = 0;
  pTVar12 = this;
  do {
    auVar15 = vpbroadcastq_avx512vl();
    lVar10 = lVar10 + 1;
    uVar9 = vpcmpeqq_avx512vl(auVar15,auVar16);
    auVar17 = vpmovm2d_avx512vl(uVar9 & 0xf);
    auVar17 = vpsrld_avx(auVar17,0x1f);
    aFVar6 = (Float  [4])vcvtdq2ps_avx(auVar17);
    (pTVar12->m).m[0] = aFVar6;
    pTVar12 = (Transform *)((pTVar12->m).m + 1);
  } while (lVar10 != 4);
  pSVar14 = &this->mInv;
  lVar10 = 0;
  do {
    auVar15 = vpbroadcastq_avx512vl();
    lVar10 = lVar10 + 1;
    uVar9 = vpcmpeqq_avx512vl(auVar15,auVar16);
    auVar17 = vpmovm2d_avx512vl(uVar9 & 0xf);
    auVar17 = vpsrld_avx(auVar17,0x1f);
    aFVar6 = (Float  [4])vcvtdq2ps_avx(auVar17);
    pSVar14->m[0] = aFVar6;
    pSVar14 = (SquareMatrix<4> *)(pSVar14->m + 1);
  } while (lVar10 != 4);
  fVar1 = (q->v).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar2 = (q->v).super_Tuple3<pbrt::Vector3,_float>.z;
  fVar3 = (q->v).super_Tuple3<pbrt::Vector3,_float>.x;
  fVar4 = q->w;
  paFVar11 = (Float (*) [4])&r;
  lVar10 = 0;
  auVar18 = SUB6416(ZEXT464(0x3f800000),0);
  auVar19 = SUB6416(ZEXT464(0xc0000000),0);
  auVar17 = vfmadd213ss_fma(ZEXT416((uint)(fVar1 * fVar1 + fVar2 * fVar2)),auVar19,auVar18);
  (this->mInv).m[0][0] = auVar17._0_4_;
  fVar5 = fVar3 * fVar1 + fVar4 * fVar2;
  fVar7 = fVar3 * fVar1 - fVar4 * fVar2;
  (this->mInv).m[0][1] = fVar5 + fVar5;
  fVar8 = fVar3 * fVar2 - fVar4 * fVar1;
  fVar5 = fVar3 * fVar2 + fVar4 * fVar1;
  (this->mInv).m[0][2] = fVar8 + fVar8;
  (this->mInv).m[1][0] = fVar7 + fVar7;
  auVar17 = vfmadd213ss_fma(ZEXT416((uint)(fVar3 * fVar3 + fVar2 * fVar2)),auVar19,auVar18);
  (this->mInv).m[1][1] = auVar17._0_4_;
  fVar7 = fVar1 * fVar2 + fVar4 * fVar3;
  fVar2 = fVar1 * fVar2 - fVar4 * fVar3;
  (this->mInv).m[1][2] = fVar7 + fVar7;
  (this->mInv).m[2][0] = fVar5 + fVar5;
  (this->mInv).m[2][1] = fVar2 + fVar2;
  auVar17 = vfmadd213ss_fma(ZEXT416((uint)(fVar3 * fVar3 + fVar1 * fVar1)),auVar19,auVar18);
  (this->mInv).m[2][2] = auVar17._0_4_;
  do {
    auVar15 = vpbroadcastq_avx512vl();
    lVar10 = lVar10 + 1;
    uVar9 = vpcmpeqq_avx512vl(auVar15,auVar16);
    auVar17 = vpmovm2d_avx512vl(uVar9 & 0xf);
    auVar17 = vpsrld_avx(auVar17,0x1f);
    auVar17 = vcvtdq2ps_avx(auVar17);
    *paFVar11 = (Float  [4])auVar17;
    paFVar11 = paFVar11 + 1;
  } while (lVar10 != 4);
  auVar16 = vpbroadcastq_avx512vl();
  auVar16 = vpaddq_avx2(auVar16,_DAT_004fc1a0);
  paFVar11 = (Float (*) [4])&r;
  puVar13 = (undefined8 *)0x0;
  do {
    auVar15 = vpbroadcastq_avx512vl();
    puVar13 = (undefined8 *)((long)puVar13 + 1);
    auVar15 = vpsllq_avx2(auVar15,2);
    vpaddq_avx2(auVar16,auVar15);
    auVar17 = vgatherqps_avx512vl(*puVar13);
    *paFVar11 = (Float  [4])auVar17;
    paFVar11 = paFVar11 + 1;
  } while (puVar13 != (undefined8 *)0x4);
  *(undefined8 *)(this->m).m[0] = r.m[0]._0_8_;
  *(undefined8 *)((this->m).m[0] + 2) = r.m[0]._8_8_;
  *(undefined8 *)(this->m).m[1] = r.m[1]._0_8_;
  *(undefined8 *)((this->m).m[1] + 2) = r.m[1]._8_8_;
  *(undefined8 *)(this->m).m[2] = r.m[2]._0_8_;
  *(undefined8 *)((this->m).m[2] + 2) = r.m[2]._8_8_;
  *(undefined8 *)(this->m).m[3] = r.m[3]._0_8_;
  *(undefined8 *)((this->m).m[3] + 2) = r.m[3]._8_8_;
  return;
}

Assistant:

inline Transform::Transform(const Quaternion &q) {
    Float xx = q.v.x * q.v.x, yy = q.v.y * q.v.y, zz = q.v.z * q.v.z;
    Float xy = q.v.x * q.v.y, xz = q.v.x * q.v.z, yz = q.v.y * q.v.z;
    Float wx = q.v.x * q.w, wy = q.v.y * q.w, wz = q.v.z * q.w;

    mInv[0][0] = 1 - 2 * (yy + zz);
    mInv[0][1] = 2 * (xy + wz);
    mInv[0][2] = 2 * (xz - wy);
    mInv[1][0] = 2 * (xy - wz);
    mInv[1][1] = 1 - 2 * (xx + zz);
    mInv[1][2] = 2 * (yz + wx);
    mInv[2][0] = 2 * (xz + wy);
    mInv[2][1] = 2 * (yz - wx);
    mInv[2][2] = 1 - 2 * (xx + yy);

    // Transpose since we are left-handed.  Ugh.
    m = Transpose(mInv);
}